

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test::
~DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test
          (DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test *this)

{
  anon_unknown_0::DatarateTestSetFrameQpRealtime::~DatarateTestSetFrameQpRealtime
            ((DatarateTestSetFrameQpRealtime *)(this + -0x4c8));
  operator_delete((DatarateTestSetFrameQpRealtime *)(this + -0x4c8));
  return;
}

Assistant:

TEST_P(DatarateTestSetFrameQpRealtime, SetFrameQpOnePass) {
  cfg_.rc_buf_initial_sz = 500;
  cfg_.rc_buf_optimal_sz = 500;
  cfg_.rc_buf_sz = 1000;
  cfg_.rc_undershoot_pct = 20;
  cfg_.rc_undershoot_pct = 20;
  cfg_.rc_min_quantizer = 0;
  cfg_.rc_max_quantizer = 50;
  cfg_.rc_end_usage = AOM_CBR;
  cfg_.rc_target_bitrate = 200;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_error_resilient = 1;
  cfg_.kf_max_dist = 9999;
  cfg_.rc_dropframe_thresh = 0;

  total_frames_ = 100;
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 100);

  ResetModel();
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}